

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring64_bitmap_range_closed_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  art_ref_t ref;
  char cVar1;
  int iVar2;
  int32_t n_runs;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  run_container_t *prVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  uint64_t uVar11;
  run_container_t *container;
  char cVar12;
  ushort x;
  ulong uVar13;
  uint8_t min_high48 [6];
  uint8_t max_high48 [6];
  art_iterator_t it;
  uint local_d8;
  ushort local_d4;
  uint local_cc;
  uint local_c8;
  ushort local_c4;
  art_iterator_t local_c0;
  
  if (max < min) {
    uVar11 = 0;
  }
  else {
    local_d8 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_d4 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_c8 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    local_c4 = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
    uVar11 = 0;
    memset(&local_c0,0,0x90);
    ref = (r->art).root;
    if (ref != 0) {
      local_c0.art = &r->art;
      art_node_iterator_lower_bound(ref,&local_c0,(art_key_chunk_t *)&local_d8);
      uVar11 = 0;
      if (local_c0.value != (ulong *)0x0) {
        x = (short)min - 1;
        local_cc = (uint)max & 0xffff;
        do {
          uVar5 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
                  (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
          uVar9 = local_c8 >> 0x18 | (local_c8 & 0xff0000) >> 8 | (local_c8 & 0xff00) << 8 |
                  local_c8 << 0x18;
          if (uVar5 == uVar9) {
            uVar8 = local_c4 << 8 | local_c4 >> 8;
            uVar5 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
            uVar9 = (uint)uVar8;
            uVar3 = 0;
            if (uVar5 != uVar8) goto LAB_00126283;
          }
          else {
LAB_00126283:
            uVar3 = -(uint)(uVar5 < uVar9) | 1;
          }
          if (0 < (int)uVar3) {
            return uVar11;
          }
          uVar13 = *local_c0.value;
          container = (run_container_t *)r->containers[uVar13 >> 8];
          cVar12 = (char)uVar13;
          if (uVar3 == 0) {
            prVar7 = container;
            cVar1 = cVar12;
            if (cVar12 == '\x04') {
              cVar1 = *(char *)&container->runs;
              prVar7 = *(run_container_t **)container;
            }
            if (cVar1 == '\x03') {
              iVar6 = run_container_rank(prVar7,(uint16_t)local_cc);
            }
            else if (cVar1 == '\x02') {
              if (prVar7->n_runs < 1) {
                iVar6 = 0;
              }
              else {
                iVar6 = prVar7->n_runs + -1;
                iVar2 = 0;
                do {
                  uVar5 = (uint)(iVar6 + iVar2) >> 1;
                  uVar8 = *(ushort *)
                           ((long)&prVar7->runs->value + (ulong)(iVar6 + iVar2 & 0xfffffffe));
                  if (uVar8 < (ushort)max) {
                    iVar2 = uVar5 + 1;
                  }
                  else {
                    if (uVar8 <= (ushort)max) {
                      iVar6 = uVar5 + 1;
                      goto LAB_001262f5;
                    }
                    iVar6 = uVar5 - 1;
                  }
                } while (iVar2 <= iVar6);
                iVar6 = -iVar2;
                if (0 < iVar2) {
                  iVar6 = iVar2;
                }
              }
            }
            else {
              iVar6 = bitset_container_rank((bitset_container_t *)prVar7,(uint16_t)local_cc);
            }
          }
          else {
            prVar7 = container;
            cVar1 = cVar12;
            if (cVar12 == '\x04') {
              cVar1 = *(char *)&container->runs;
              prVar7 = *(run_container_t **)container;
            }
            if (cVar1 == '\x03') {
              uVar5 = croaring_hardware_support();
              if ((uVar5 & 2) == 0) {
                uVar5 = croaring_hardware_support();
                if ((uVar5 & 1) == 0) {
                  iVar6 = prVar7->n_runs;
                  lVar4 = (long)iVar6;
                  if (0 < lVar4) {
                    lVar10 = 0;
                    do {
                      iVar6 = iVar6 + (uint)prVar7->runs[lVar10].length;
                      lVar10 = lVar10 + 1;
                    } while (lVar4 != lVar10);
                  }
                }
                else {
                  iVar6 = _avx2_run_container_cardinality(prVar7);
                }
              }
              else {
                iVar6 = _avx512_run_container_cardinality(prVar7);
              }
            }
            else {
              iVar6 = prVar7->n_runs;
            }
          }
LAB_001262f5:
          uVar11 = uVar11 + (long)iVar6;
          if (((short)min != 0) &&
             (local_c0.key._4_2_ == local_d4 && local_c0.key._0_4_ == local_d8)) {
            if (cVar12 == '\x04') {
              uVar13 = (ulong)*(byte *)&container->runs;
              container = *(run_container_t **)container;
            }
            if ((char)uVar13 == '\x03') {
              iVar6 = run_container_rank(container,x);
            }
            else if (((uint)uVar13 & 0xff) == 2) {
              if (container->n_runs < 1) {
                iVar6 = 0;
              }
              else {
                iVar6 = container->n_runs + -1;
                iVar2 = 0;
                do {
                  uVar5 = (uint)(iVar6 + iVar2) >> 1;
                  uVar8 = *(ushort *)
                           ((long)&container->runs->value + (ulong)(iVar6 + iVar2 & 0xfffffffe));
                  if (uVar8 < x) {
                    iVar2 = uVar5 + 1;
                  }
                  else {
                    if (uVar8 <= x) {
                      iVar6 = uVar5 + 1;
                      goto LAB_001264bc;
                    }
                    iVar6 = uVar5 - 1;
                  }
                } while (iVar2 <= iVar6);
                iVar6 = -iVar2;
                if (0 < iVar2) {
                  iVar6 = iVar2;
                }
              }
            }
            else {
              iVar6 = bitset_container_rank((bitset_container_t *)container,x);
            }
LAB_001264bc:
            uVar11 = uVar11 - (long)iVar6;
          }
          art_iterator_move(&local_c0,true);
        } while (local_c0.value != (ulong *)0x0);
      }
    }
  }
  return uVar11;
}

Assistant:

uint64_t roaring64_bitmap_range_closed_cardinality(const roaring64_bitmap_t *r,
                                                   uint64_t min, uint64_t max) {
    if (min > max) {
        return 0;
    }

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);
        container_t *container = get_container(r, leaf);
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality += container_rank(container, typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality += container_get_cardinality(container, typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -= container_rank(container, typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}